

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O0

void __thiscall CVmImageFileExt_blk::CVmImageFileExt_blk(CVmImageFileExt_blk *this,size_t siz)

{
  void *pvVar1;
  size_t in_RSI;
  undefined8 *in_RDI;
  
  pvVar1 = malloc(in_RSI);
  in_RDI[2] = pvVar1;
  in_RDI[3] = in_RSI;
  in_RDI[4] = in_RDI[2];
  in_RDI[1] = 0;
  *in_RDI = 0;
  return;
}

Assistant:

CVmImageFileExt_blk::CVmImageFileExt_blk(size_t siz)
{
    /* allocate the associated memory block */
    block_ptr_ = (char *)t3malloc(siz);

    /* remember the amount of space remaining */
    rem_ = siz;

    /* the next byte free is the first byte */
    free_ptr_ = block_ptr_;

    /* nothing else is in our list yet */
    nxt_ = prv_ = 0;
}